

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<_std::is_class<typename_std::decay_t<int_&>_>::value,_void>
pbrt::detail::stringPrintfRecursiveWithPrecision<int&,int&>
          (string *s,char *fmt,string *nextFmt,int precision,int *v,int *args)

{
  size_t __maxlen;
  int iVar1;
  char *pcVar2;
  char *__format;
  uint in_ECX;
  string *in_RDI;
  uint *in_R8;
  string str;
  size_t size;
  int *in_stack_000001d0;
  char *in_stack_000001d8;
  string *in_stack_000001e0;
  string local_58 [32];
  size_t local_38;
  uint *local_28;
  uint local_1c;
  string *local_8;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_8 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = snprintf((char *)0x0,0,pcVar2,(ulong)local_1c,(ulong)*local_28);
  local_38 = (size_t)(iVar1 + 1);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::resize((ulong)local_58);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
  __maxlen = local_38;
  __format = (char *)std::__cxx11::string::c_str();
  snprintf(pcVar2,__maxlen,__format,(ulong)local_1c,(ulong)*local_28);
  std::__cxx11::string::pop_back();
  std::__cxx11::string::operator+=(local_8,local_58);
  stringPrintfRecursive<int&>(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}